

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsTypes.cpp
# Opt level: O3

string * __thiscall
helics::helicsVectorString_abi_cxx11_
          (string *__return_storage_ptr__,helics *this,double *vals,size_t size)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  string_view fmt;
  format_args args;
  helics **local_38;
  code *local_30;
  helics *local_28;
  helics *local_20;
  char *local_18;
  undefined8 local_10;
  
  local_20 = this + (long)vals * 8;
  local_38 = &local_28;
  local_18 = ",";
  local_10 = 1;
  local_30 = ::fmt::v11::detail::value<fmt::v11::context>::
             format_custom<fmt::v11::join_view<double_const*,double_const*,char>,fmt::v11::formatter<fmt::v11::join_view<double_const*,double_const*,char>,char,void>>
  ;
  fmt.size_ = 0xf;
  fmt.data_ = (char *)0x4;
  args.field_1.args_ = in_R9.args_;
  args.desc_ = (unsigned_long_long)&local_38;
  local_28 = this;
  ::fmt::v11::vformat_abi_cxx11_((string *)__return_storage_ptr__,(v11 *)"[{}]",fmt,args);
  return __return_storage_ptr__;
}

Assistant:

std::string helicsVectorString(const double* vals, size_t size)
{
    return fmt::format("[{}]", fmt::join(vals, vals + size, ","));
}